

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O0

int scp_send_dirname(char *name,int modes)

{
  Backend *pBVar1;
  sftp_request *psVar2;
  sftp_packet *psVar3;
  size_t sVar4;
  char local_a8 [8];
  char buf [40];
  _Bool ret;
  sftp_request *req;
  sftp_packet *pktin;
  fxp_attrs attrs;
  char *err;
  char *fullname;
  int modes_local;
  char *name_local;
  
  if (using_sftp) {
    if (scp_sftp_targetisdir) {
      err = dupcat_fn(scp_sftp_remotepath,"/",name,0);
    }
    else {
      err = dupstr(scp_sftp_remotepath);
    }
    psVar2 = fxp_mkdir_send(err,(fxp_attrs *)0x0);
    psVar3 = sftp_wait_for_reply(psVar2);
    buf[0x27] = fxp_mkdir_recv(psVar3,psVar2);
    if ((bool)buf[0x27]) {
      attrs.mtime = (unsigned_long)anon_var_dwarf_1b2;
    }
    else {
      attrs.mtime = (unsigned_long)fxp_error();
    }
    psVar2 = fxp_stat_send(err);
    psVar3 = sftp_wait_for_reply(psVar2);
    buf[0x27] = fxp_stat_recv(psVar3,psVar2,(fxp_attrs *)&pktin);
    if ((((bool)buf[0x27]) && (((ulong)pktin & 4) != 0)) && ((attrs.gid & 0x4000) != 0)) {
      scp_sftp_remotepath = err;
      name_local._4_4_ = 0;
    }
    else {
      tell_user(_stderr,"unable to create directory %s: %s",err,attrs.mtime);
      safefree(err);
      errs = errs + 1;
      name_local._4_4_ = 1;
    }
  }
  else {
    sprintf(local_a8,"D%04o 0 ",(ulong)(uint)modes);
    pBVar1 = backend;
    sVar4 = strlen(local_a8);
    backend_send(pBVar1,local_a8,sVar4);
    pBVar1 = backend;
    sVar4 = strlen(name);
    backend_send(pBVar1,name,sVar4);
    backend_send(backend,"\n",1);
    name_local._4_4_ = response();
  }
  return name_local._4_4_;
}

Assistant:

int scp_send_dirname(const char *name, int modes)
{
    if (using_sftp) {
        char *fullname;
        char const *err;
        struct fxp_attrs attrs;
        struct sftp_packet *pktin;
        struct sftp_request *req;
        bool ret;

        if (scp_sftp_targetisdir) {
            fullname = dupcat(scp_sftp_remotepath, "/", name);
        } else {
            fullname = dupstr(scp_sftp_remotepath);
        }

        /*
         * We don't worry about whether we managed to create the
         * directory, because if it exists already it's OK just to
         * use it. Instead, we will stat it afterwards, and if it
         * exists and is a directory we will assume we were either
         * successful or it didn't matter.
         */
        req = fxp_mkdir_send(fullname, NULL);
        pktin = sftp_wait_for_reply(req);
        ret = fxp_mkdir_recv(pktin, req);

        if (!ret)
            err = fxp_error();
        else
            err = "server reported no error";

        req = fxp_stat_send(fullname);
        pktin = sftp_wait_for_reply(req);
        ret = fxp_stat_recv(pktin, req, &attrs);

        if (!ret || !(attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS) ||
            !(attrs.permissions & 0040000)) {
            tell_user(stderr, "unable to create directory %s: %s",
                      fullname, err);
            sfree(fullname);
            errs++;
            return 1;
        }

        scp_sftp_remotepath = fullname;

        return 0;
    } else {
        char buf[40];
        sprintf(buf, "D%04o 0 ", modes);
        backend_send(backend, buf, strlen(buf));
        backend_send(backend, name, strlen(name));
        backend_send(backend, "\n", 1);
        return response();
    }
}